

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timeline.hpp
# Opt level: O0

microseconds __thiscall ableton::link::Timeline::fromBeats(Timeline *this,Beats *beats)

{
  type tVar1;
  _Head_base<0UL,_long,_false> local_40;
  _Head_base<0UL,_long,_false> local_38;
  Beats local_30;
  duration<long,_std::ratio<1L,_1000000L>_> local_28;
  Beats *local_20;
  Beats *beats_local;
  Timeline *this_local;
  
  local_38._M_head_impl =
       (beats->super_tuple<long>).super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>.
       _M_head_impl;
  local_40._M_head_impl =
       (this->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_20 = beats;
  beats_local = (Beats *)this;
  link::operator-((link *)&local_30,(Beats *)&local_38,(Beats *)&local_40);
  local_28.__r = (rep)Tempo::beatsToMicros(&this->tempo,&local_30);
  tVar1 = std::chrono::operator+(&this->timeOrigin,&local_28);
  return (microseconds)tVar1.__r;
}

Assistant:

std::chrono::microseconds fromBeats(const Beats beats) const
  {
    return timeOrigin + tempo.beatsToMicros(beats - beatOrigin);
  }